

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.c
# Opt level: O2

void av1_prune_partitions_before_search
               (AV1_COMP *cpi,MACROBLOCK *x,SIMPLE_MOTION_DATA_TREE *sms_tree,
               PartitionSearchState *part_state)

{
  CommonModeInfoParams *mi_params;
  float fVar1;
  int iVar2;
  int iVar3;
  aom_bit_depth_t bit_depth;
  NN_CONFIG *pNVar4;
  _Bool _Var5;
  int16_t iVar6;
  int idx;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  float *pfVar13;
  uint uVar14;
  long lVar15;
  float *pfVar16;
  long lVar17;
  float *pfVar18;
  int *piVar19;
  ulong uVar20;
  long lVar21;
  BLOCK_SIZE BVar22;
  BLOCK_SIZE bsize;
  ulong uVar23;
  uint uVar24;
  bool bVar25;
  bool bVar26;
  float fVar27;
  int in_stack_ffffffffffffd3a8;
  ulong in_stack_ffffffffffffd3b0;
  uint8_t *image [1];
  int out_chs [4];
  int output_dims [4];
  float features [17];
  aom_partition_features_t features_1;
  float dnn_features [100];
  int local_68;
  int iStack_64;
  undefined8 uStack_60;
  int local_58;
  int local_54 [2];
  
  BVar22 = (part_state->part_blk_params).bsize;
  if ((cpi->sf).part_sf.rect_partition_eval_thresh < (int)(uint)BVar22) {
    part_state->do_rectangular_split = 0;
    part_state->partition_rect_allowed[0] = 0;
    part_state->partition_rect_allowed[1] = 0;
  }
  iVar2 = (cpi->sf).part_sf.prune_rectangular_split_based_on_qidx;
  uVar24 = (uint)BVar22;
  if (iVar2 == 2) {
    uVar7 = ((x->qindex * 3) / 0x100) * -3;
    uVar14 = 0xfffffff7;
    if (-9 < (int)uVar7) {
      uVar14 = uVar7;
    }
    if (uVar24 < ((int)uVar14 >> 0x1f & uVar14) + 9) goto LAB_001d1282;
  }
  else if (((iVar2 == 1) && (BVar22 == BLOCK_8X8)) && (x->qindex < 0x23)) {
LAB_001d1282:
    part_state->do_rectangular_split = 0;
    part_state->partition_rect_allowed[0] = 0;
    part_state->partition_rect_allowed[1] = 0;
  }
  iVar2 = (cpi->sf).part_sf.prune_sub_8x8_partition_level;
  if ((BVar22 == BLOCK_8X8 && iVar2 != 0) &&
     ((iVar2 == 2 ||
      ((((x->e_mbd).left_available == true && ((x->e_mbd).up_available == true)) &&
       ((BLOCK_8X8 < ((x->e_mbd).left_mbmi)->bsize || (BLOCK_8X8 < ((x->e_mbd).above_mbmi)->bsize)))
       ))))) {
    part_state->partition_rect_allowed[0] = 0;
    part_state->partition_rect_allowed[1] = 0;
    part_state->do_rectangular_split = 0;
    part_state->do_square_split = 0;
  }
  mi_params = &(cpi->common).mi_params;
  if (((((cpi->common).current_frame.frame_type & 0xfd) == 0) &&
      (iVar2 = (cpi->sf).part_sf.intra_cnn_based_part_prune_level, iVar2 != 0)) &&
     ((BVar22 < BLOCK_64X128 &&
      (((BLOCK_64X32 < ((cpi->common).seq_params)->sb_size &&
        ((part_state->part_blk_params).bsize_at_least_8x8 != 0)) &&
       (_Var5 = av1_is_whole_blk_in_frame(&part_state->part_blk_params,mi_params), _Var5)))))) {
    iVar11 = (x->part_search_info).quad_tree_idx;
    in_stack_ffffffffffffd3b0 = (ulong)iVar11;
    iVar9 = convert_bsize_to_idx(BVar22);
    iVar10 = (x->part_search_info).cnn_output_valid;
    if (uVar24 == 0xc) {
      if (iVar10 == 0) {
        features[0] = 1.4013e-45;
        features[1] = 0.0;
        features[2] = 0.0;
        features[3] = 0.0;
        output_dims[0] = 1;
        output_dims[1] = 2;
        output_dims[2] = 4;
        output_dims[3] = 8;
        out_chs[0] = 0x14;
        out_chs[1] = 4;
        out_chs[2] = 0x14;
        out_chs[3] = 0x14;
        pfVar18 = (x->part_search_info).cnn_buffer;
        pfVar16 = dnn_features;
        for (lVar15 = 0; lVar15 != 4; lVar15 = lVar15 + 1) {
          uVar14 = out_chs[lVar15];
          iVar10 = output_dims[lVar15];
          uVar20 = 0;
          if (0 < (int)uVar14) {
            uVar20 = (ulong)uVar14;
          }
          for (uVar23 = 0; uVar20 != uVar23; uVar23 = uVar23 + 1) {
            *(float **)(pfVar16 + uVar23 * 2) = pfVar18;
            pfVar18 = pfVar18 + (uint)(iVar10 * iVar10);
          }
          pfVar16 = pfVar16 + (long)(int)uVar14 * 2;
        }
        features_1.id = AOM_EXT_PART_FEATURE_AFTER_SPLIT;
        features_1.before_part_none.f._4_8_ = out_chs;
        features_1.before_part_none.f._12_8_ = output_dims;
        features_1.before_part_none.f._20_8_ = dnn_features;
        bit_depth = (x->e_mbd).bd;
        iVar6 = av1_dc_quant_QTX(x->qindex,0,bit_depth);
        iVar10 = (int)iVar6 >> ((char)bit_depth - 8U & 0x1f);
        fVar27 = log1pf((float)(iVar10 * iVar10) * 0.00390625);
        (x->part_search_info).log_q = (fVar27 + -1.191922) / 1.730044;
        iVar10 = x->plane[0].src.stride;
        if ((((x->e_mbd).cur_buf)->flags & 8) == 0) {
          image[0] = x->plane[0].src.buf + ~(long)iVar10;
          _Var5 = av1_cnn_predict_img_multi_out
                            (image,0x41,0x41,iVar10,&av1_intra_mode_cnn_partition_cnn_config,
                             (CNN_THREAD_DATA *)features,(CNN_MULTI_OUT *)&features_1);
        }
        else {
          image[0] = (uint8_t *)((long)x->plane[0].src.buf * 2 + (long)iVar10 * -2 + -2);
          _Var5 = av1_cnn_predict_img_multi_out_highbd
                            ((uint16_t **)image,0x41,0x41,iVar10,
                             &av1_intra_mode_cnn_partition_cnn_config,(CNN_THREAD_DATA *)features,
                             bit_depth,(CNN_MULTI_OUT *)&features_1);
        }
        if (_Var5 == false) {
          aom_internal_error((x->e_mbd).error_info,AOM_CODEC_MEM_ERROR,"Error allocating CNN data");
          goto LAB_001d1302;
        }
        (x->part_search_info).cnn_output_valid = 1;
      }
    }
    else if (iVar10 == 0) goto LAB_001d1302;
    pfVar16 = (x->part_search_info).cnn_buffer + 0x14;
    lVar15 = (long)iVar9;
    pNVar4 = *(NN_CONFIG **)(&DAT_00546980 + lVar15 * 8);
    features_1.id = AOM_EXT_PART_FEATURE_BEFORE_NONE;
    features_1.before_part_none.f[0] = 0.0;
    features_1.before_part_none.f[1] = 0.0;
    features_1.before_part_none.f[2] = 0.0;
    if (uVar24 == 0xc) {
      for (lVar12 = 0; lVar12 != 0x14; lVar12 = lVar12 + 1) {
        dnn_features[lVar12] = (x->part_search_info).cnn_buffer[lVar12];
      }
      iVar11 = 0x14;
      for (lVar12 = 0; lVar17 = (long)iVar11, lVar12 != 4; lVar12 = lVar12 + 1) {
        iVar11 = iVar11 + 4;
        for (lVar21 = 0; lVar21 != 0x10; lVar21 = lVar21 + 4) {
          *(float *)((long)dnn_features + lVar21 + lVar17 * 4) = pfVar16[lVar21];
        }
        pfVar16 = pfVar16 + 1;
      }
      dnn_features[lVar17] = (x->part_search_info).log_q;
    }
    else if (uVar24 == 3) {
      pfVar16 = (x->part_search_info).cnn_buffer +
                (long)(int)av1_partition_breakout_nn_bias_128_layer0
                           [(long)((iVar11 + -1) / 4) + 0x1f] + 0x24;
      for (lVar12 = 0; lVar12 != 0x14; lVar12 = lVar12 + 1) {
        dnn_features[lVar12] = *pfVar16;
        pfVar16 = pfVar16 + 0x10;
      }
      pfVar16 = (x->part_search_info).cnn_buffer +
                (long)(int)av1_partition_breakout_nn_bias_128_layer0
                           [in_stack_ffffffffffffd3b0 + 0x1f] + 0x164;
      for (lVar12 = 0; lVar12 != 0x14; lVar12 = lVar12 + 1) {
        dnn_features[lVar12 + 0x14] = *pfVar16;
        pfVar16 = pfVar16 + 0x40;
      }
      dnn_features[0x28] = (x->part_search_info).log_q;
    }
    else {
      if (uVar24 == 6) {
        iVar11 = *(int *)(&DAT_00457aac + (long)((iVar11 + -1) / 4) * 4);
        for (lVar12 = 0; lVar12 != 0x10; lVar12 = lVar12 + 4) {
          *(float *)((long)dnn_features + lVar12) = pfVar16[iVar11 + lVar12];
        }
        pfVar16 = (x->part_search_info).cnn_buffer +
                  (long)(int)av1_partition_breakout_nn_bias_128_layer0
                             [in_stack_ffffffffffffd3b0 + 0x1f] + 0x24;
        for (lVar12 = 4; lVar12 != 0x18; lVar12 = lVar12 + 1) {
          dnn_features[lVar12] = *pfVar16;
          pfVar16 = pfVar16 + 0x10;
        }
      }
      else {
        if (uVar24 != 9) goto LAB_001d1d22;
        for (lVar12 = 0; lVar12 != 0x14; lVar12 = lVar12 + 1) {
          dnn_features[lVar12] = (x->part_search_info).cnn_buffer[lVar12];
        }
        iVar11 = *(int *)(&DAT_00457aac + in_stack_ffffffffffffd3b0 * 4);
        for (lVar12 = 0; lVar12 != 0x10; lVar12 = lVar12 + 4) {
          *(float *)((long)dnn_features + lVar12 + 0x50) = pfVar16[iVar11 + lVar12];
        }
      }
      dnn_features[0x18] = (x->part_search_info).log_q;
    }
LAB_001d1d22:
    (*av1_nn_predict)(dnn_features,pNVar4,1,(float *)&features_1);
    iVar11 = (cpi->common).width;
    iVar10 = (cpi->common).height;
    if (iVar11 < iVar10) {
      iVar10 = iVar11;
    }
    pfVar16 = av1_intra_mode_cnn_partition_split_thresh_lowres;
    if (0x1df < iVar10) {
      pfVar16 = av1_intra_mode_cnn_partition_split_thresh_midres;
    }
    pfVar18 = av1_intra_mode_cnn_partition_no_split_thresh_lowres;
    if (0x1df < iVar10) {
      pfVar18 = av1_intra_mode_cnn_partition_no_split_thresh_midres;
    }
    pfVar13 = av1_intra_mode_cnn_partition_split_thresh_hdres;
    if (iVar10 < 0x2d0) {
      pfVar13 = pfVar16;
    }
    pfVar16 = av1_intra_mode_cnn_partition_no_split_thresh_hdres;
    if (iVar10 < 0x2d0) {
      pfVar16 = pfVar18;
    }
    fVar27 = pfVar16[lVar15];
    if (pfVar13[lVar15] <= (float)features_1.id && (float)features_1.id != pfVar13[lVar15]) {
      if (iVar2 != 1) {
        part_state->partition_none_allowed = 0;
      }
      part_state->partition_rect_allowed[0] = 0;
      part_state->partition_rect_allowed[1] = 0;
      part_state->do_rectangular_split = 0;
      part_state->do_square_split = 1;
    }
    if ((float)features_1.id < fVar27) {
      part_state->do_square_split = 0;
    }
  }
LAB_001d1302:
  if (((((cpi->sf).part_sf.simple_motion_search_split != 0) && (part_state->do_square_split != 0))
      && (((part_state->part_blk_params).bsize_at_least_8x8 != 0 &&
          ((_Var5 = av1_is_whole_blk_in_frame(&part_state->part_blk_params,mi_params), _Var5 &&
           (((cpi->common).current_frame.frame_type & 0xfd) != 0)))))) &&
     (iVar2 = (cpi->common).width, iVar2 == (cpi->common).superres_upscaled_width)) {
    iVar11 = (part_state->part_blk_params).mi_row;
    iVar10 = (part_state->part_blk_params).mi_col;
    BVar22 = (part_state->part_blk_params).bsize;
    iVar8 = convert_bsize_to_idx(BVar22);
    iVar9 = (cpi->common).height;
    if (iVar2 < iVar9) {
      iVar9 = iVar2;
    }
    iVar2 = (cpi->sf).part_sf.simple_motion_search_prune_agg;
    if ((long)iVar2 != -1) {
      piVar19 = &DAT_00438210;
      if (iVar2 < 4) {
        piVar19 = quad_to_linear_1 + iVar2;
      }
      lVar15 = (long)*piVar19;
      if (-1 < lVar15) {
        lVar17 = (long)iVar8;
        iVar2 = *(int *)(av1_simple_motion_search_split_mean_rel + lVar17 * 4);
        iVar8 = *(int *)(av1_simple_motion_search_split_std_rel + lVar17 * 4);
        iVar3 = *(int *)(av1_simple_motion_search_split_nn_config_rel + lVar17 * 4);
        lVar12 = (ulong)(0x1df < iVar9) + (ulong)(0x2cf < iVar9);
        fVar27 = av1_simple_motion_search_split_thresh[lVar15][lVar12][lVar17];
        in_stack_ffffffffffffd3b0 = (ulong)(uint)fVar27;
        fVar1 = av1_simple_motion_search_no_split_thresh[lVar15][lVar12][lVar17];
        features[0xc] = 0.0;
        features[0xd] = 0.0;
        features[0xe] = 0.0;
        features[0xf] = 0.0;
        features[8] = 0.0;
        features[9] = 0.0;
        features[10] = 0.0;
        features[0xb] = 0.0;
        features[4] = 0.0;
        features[5] = 0.0;
        features[6] = 0.0;
        features[7] = 0.0;
        features[0] = 0.0;
        features[1] = 0.0;
        features[2] = 0.0;
        features[3] = 0.0;
        stack0xffffffffffffd458 = stack0xffffffffffffd458 & 0xffffffff00000000;
        simple_motion_search_prune_part_features(cpi,x,sms_tree,iVar11,iVar10,BVar22,features,3);
        write_features_to_file
                  ((cpi->oxcf).partition_info_path,(cpi->ext_part_controller).test_mode != 0,
                   features,0x11,0,BVar22,in_stack_ffffffffffffd3a8,(int)fVar27);
        if ((cpi->ext_part_controller).ready != 0) {
          features_1._0_8_ = features_1._0_8_ & 0xffffffff00000000;
          for (lVar15 = 1; lVar15 != 0x12; lVar15 = lVar15 + 1) {
            features_1.before_part_none.f[lVar15 + -1] = (float)output_dims[lVar15 + 3];
          }
          av1_ext_part_send_features(&cpi->ext_part_controller,&features_1);
          _Var5 = av1_ext_part_get_partition_decision
                            (&cpi->ext_part_controller,(aom_partition_decision_t *)dnn_features);
          if (_Var5) {
            part_state->partition_none_allowed = local_68;
            part_state->partition_rect_allowed[0] = iStack_64;
            *(undefined8 *)(part_state->partition_rect_allowed + 1) = uStack_60;
            part_state->do_square_split = local_58;
            goto LAB_001d1720;
          }
        }
        for (lVar15 = 0; lVar15 != 0x11; lVar15 = lVar15 + 1) {
          features[lVar15] =
               (features[lVar15] -
               *(float *)(av1_simple_motion_search_split_mean_rel + lVar15 * 4 + (long)iVar2)) /
               *(float *)(av1_simple_motion_search_split_std_rel + (long)iVar8 + lVar15 * 4);
        }
        dnn_features._0_8_ = dnn_features._0_8_ & 0xffffffff00000000;
        (*av1_nn_predict)(features,(NN_CONFIG *)
                                   (av1_simple_motion_search_split_nn_config_rel + iVar3),1,
                          dnn_features);
        if (fVar27 < dnn_features[0]) {
          part_state->do_square_split = 1;
          part_state->partition_none_allowed = 0;
          part_state->partition_rect_allowed[0] = 0;
          *(undefined8 *)(part_state->partition_rect_allowed + 1) = 0;
        }
        if ((1 < (cpi->sf).part_sf.simple_motion_search_split) && (dnn_features[0] < fVar1)) {
          part_state->do_square_split = 0;
        }
        lVar15 = (long)(cpi->sf).part_sf.simple_motion_search_rect_split;
        if ((lVar15 != 0) &&
           (dnn_features[0] <
            *(float *)(&DAT_00457ae0 + (ulong)(0x2cf < iVar9) * 4) *
            av1_simple_motion_search_no_split_thresh[lVar15][lVar12][lVar17])) {
          part_state->do_rectangular_split = 0;
        }
      }
    }
  }
LAB_001d1720:
  bVar25 = true;
  if (part_state->do_square_split == 0) {
    bVar25 = part_state->partition_none_allowed != 0;
  }
  if (part_state->do_rectangular_split == 0) {
LAB_001d1765:
    bVar26 = false;
  }
  else if ((part_state->partition_rect_allowed[0] == 0) || (part_state->prune_rect_part[0] != 0)) {
    if (part_state->partition_rect_allowed[1] == 0) goto LAB_001d1765;
    bVar26 = part_state->prune_rect_part[1] == 0;
  }
  else {
    bVar26 = true;
  }
  if ((cpi->sf).part_sf.simple_motion_search_prune_rect == 0) {
    return;
  }
  if (!(bool)(bVar25 & bVar26 & ((cpi->common).current_frame.frame_type & 0xfd) != 0)) {
    return;
  }
  iVar2 = (cpi->common).width;
  if (iVar2 != (cpi->common).superres_upscaled_width) {
    return;
  }
  iVar11 = (part_state->part_blk_params).mi_row;
  iVar10 = (part_state->part_blk_params).mi_col;
  BVar22 = (part_state->part_blk_params).bsize;
  iVar8 = convert_bsize_to_idx(BVar22);
  iVar9 = (cpi->common).height;
  if (iVar2 < iVar9) {
    iVar9 = iVar2;
  }
  iVar2 = (cpi->sf).part_sf.simple_motion_search_prune_agg;
  if ((long)iVar2 == -1) {
    return;
  }
  piVar19 = &DAT_00438210 + (x->qindex < 0x5b);
  if (iVar2 < 4) {
    piVar19 = quad_to_linear_1 + iVar2;
  }
  if ((long)*piVar19 < 0) {
    return;
  }
  lVar15 = (long)iVar8;
  fVar27 = av1_simple_motion_search_prune_rect_thresh[*piVar19]
           [(ulong)(0x1df < iVar9) + (ulong)(0x2cf < iVar9)][lVar15];
  if ((fVar27 == 0.0) && (!NAN(fVar27))) {
    return;
  }
  iVar2 = *(int *)(av1_simple_motion_search_prune_rect_nn_config_rel + lVar15 * 4);
  iVar9 = *(int *)(av1_simple_motion_search_prune_rect_mean_rel + lVar15 * 4);
  iVar8 = *(int *)(av1_simple_motion_search_prune_rect_std_rel + lVar15 * 4);
  stack0xffffffffffffd458 = 0;
  features[0xc] = 0.0;
  features[0xd] = 0.0;
  features[0xe] = 0.0;
  features[0xf] = 0.0;
  features[8] = 0.0;
  features[9] = 0.0;
  features[10] = 0.0;
  features[0xb] = 0.0;
  features[4] = 0.0;
  features[5] = 0.0;
  features[6] = 0.0;
  features[7] = 0.0;
  features[0] = 0.0;
  features[1] = 0.0;
  features[2] = 0.0;
  features[3] = 0.0;
  bsize = BVar22;
  simple_motion_search_prune_part_features(cpi,x,sms_tree,iVar11,iVar10,BVar22,features,7);
  if (((cpi->sf).part_sf.simple_motion_search_prune_rect != 0) &&
     (((cpi->common).current_frame.frame_type & 0xfd) != 0)) {
    if (part_state->partition_rect_allowed[0] == 0) {
      if ((BVar22 < BLOCK_8X8) || (part_state->partition_rect_allowed[1] == 0)) goto LAB_001d1e18;
    }
    else if (BVar22 < BLOCK_8X8) goto LAB_001d1e18;
    if (((cpi->common).width == (cpi->common).superres_upscaled_width) &&
       (write_features_to_file
                  ((cpi->oxcf).partition_info_path,(cpi->ext_part_controller).test_mode != 0,
                   features,0x19,1,bsize,in_stack_ffffffffffffd3a8,
                   (int)CONCAT71((int7)(in_stack_ffffffffffffd3b0 >> 8),BVar22)),
       (cpi->ext_part_controller).ready != 0)) {
      features_1.id = AOM_EXT_PART_FEATURE_BEFORE_NONE_PART2;
      for (lVar15 = 0; lVar15 != 0x19; lVar15 = lVar15 + 1) {
        features_1.before_part_none.f_part2[lVar15] = features[lVar15];
      }
      av1_ext_part_send_features(&cpi->ext_part_controller,&features_1);
      _Var5 = av1_ext_part_get_partition_decision
                        (&cpi->ext_part_controller,(aom_partition_decision_t *)dnn_features);
      if (_Var5) {
        *&part_state->prune_rect_part = local_54;
        return;
      }
    }
  }
LAB_001d1e18:
  for (lVar15 = 0; lVar15 != 0x19; lVar15 = lVar15 + 1) {
    features[lVar15] =
         (features[lVar15] -
         *(float *)(av1_simple_motion_search_prune_rect_mean_rel + lVar15 * 4 + (long)iVar9)) /
         *(float *)(av1_simple_motion_search_prune_rect_std_rel + lVar15 * 4 + (long)iVar8);
  }
  dnn_features[8] = 0.0;
  dnn_features[9] = 0.0;
  dnn_features[4] = 0.0;
  dnn_features[5] = 0.0;
  dnn_features[6] = 0.0;
  dnn_features[7] = 0.0;
  dnn_features[0] = 0.0;
  dnn_features[1] = 0.0;
  dnn_features[2] = 0.0;
  dnn_features[3] = 0.0;
  features_1.before_part_none.f[3] = 0.0;
  features_1.before_part_none.f[4] = 0.0;
  features_1.before_part_none.f[5] = 0.0;
  features_1.before_part_none.f[6] = 0.0;
  features_1.id = AOM_EXT_PART_FEATURE_BEFORE_NONE;
  features_1.before_part_none.f[0] = 0.0;
  features_1.before_part_none.f[1] = 0.0;
  features_1.before_part_none.f[2] = 0.0;
  features_1.before_part_none.f[7] = 0.0;
  features_1.before_part_none.f[8] = 0.0;
  iVar11 = 10;
  if (BVar22 == BLOCK_8X8) {
    iVar11 = 4;
  }
  if (BVar22 == BLOCK_128X128) {
    iVar11 = 4;
  }
  (*av1_nn_predict)(features,(NN_CONFIG *)
                             (av1_simple_motion_search_prune_rect_nn_config_rel + iVar2),1,
                    dnn_features);
  av1_nn_softmax(dnn_features,(float *)&features_1,iVar11);
  if (features_1.before_part_none.f[0] <= fVar27) {
    part_state->prune_rect_part[0] = 1;
  }
  if (features_1.before_part_none.f[1] <= fVar27) {
    part_state->prune_rect_part[1] = 1;
  }
  return;
}

Assistant:

void av1_prune_partitions_before_search(AV1_COMP *const cpi,
                                        MACROBLOCK *const x,
                                        SIMPLE_MOTION_DATA_TREE *const sms_tree,
                                        PartitionSearchState *part_state) {
  const AV1_COMMON *const cm = &cpi->common;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;

  const PartitionBlkParams *blk_params = &part_state->part_blk_params;
  const BLOCK_SIZE bsize = blk_params->bsize;

#if CONFIG_THREE_PASS
  if (cpi->third_pass_ctx) {
    int mi_row = blk_params->mi_row;
    int mi_col = blk_params->mi_col;
    double ratio_h, ratio_w;
    av1_get_third_pass_ratio(cpi->third_pass_ctx, 0, cm->height, cm->width,
                             &ratio_h, &ratio_w);
    THIRD_PASS_MI_INFO *this_mi = av1_get_third_pass_mi(
        cpi->third_pass_ctx, 0, mi_row, mi_col, ratio_h, ratio_w);
    BLOCK_SIZE third_pass_bsize =
        av1_get_third_pass_adjusted_blk_size(this_mi, ratio_h, ratio_w);
    // check the actual partition of this block in the second pass
    PARTITION_TYPE third_pass_part =
        av1_third_pass_get_sb_part_type(cpi->third_pass_ctx, this_mi);

    int is_edge = (mi_row + mi_size_high[bsize] >= cm->mi_params.mi_rows) ||
                  (mi_col + mi_size_wide[bsize] >= cm->mi_params.mi_cols);

    if (!is_edge && block_size_wide[bsize] >= 16) {
      // If in second pass we used rectangular partition, then do not search for
      // rectangular partition in the different direction.
      if (third_pass_part != PARTITION_NONE) {
        if (third_pass_part == PARTITION_HORZ ||
            third_pass_part == PARTITION_HORZ_4 ||
            third_pass_part == PARTITION_HORZ_A ||
            third_pass_part == PARTITION_HORZ_B) {
          part_state->partition_rect_allowed[VERT] = 0;
        } else if (third_pass_part == PARTITION_VERT ||
                   third_pass_part == PARTITION_VERT_4 ||
                   third_pass_part == PARTITION_VERT_A ||
                   third_pass_part == PARTITION_VERT_B) {
          part_state->partition_rect_allowed[HORZ] = 0;
        }
      }

      int minSize = AOMMIN(block_size_wide[third_pass_bsize],
                           block_size_high[third_pass_bsize]);
      int maxSize = AOMMAX(block_size_wide[third_pass_bsize],
                           block_size_high[third_pass_bsize]);
      if (block_size_wide[bsize] < minSize / 4) {
        // Current partition is too small, just terminate
        part_state->terminate_partition_search = 1;
        return;
      } else if (block_size_wide[bsize] < minSize / 2) {
        if (third_pass_part != PARTITION_NONE) {
          // Current partition is very small, and in second pass we used
          // rectangular partition. Terminate the search here then.
          part_state->terminate_partition_search = 1;
          return;
        } else {
          // Partition is small, but we still check this partition, only disable
          // further splits.
          // TODO(any): check why this is not covered by the termination for <
          // minSize/4.
          av1_disable_square_split_partition(part_state);
          av1_disable_rect_partitions(part_state);
          return;
        }
      } else if (block_size_wide[bsize] > maxSize) {
        // Partition is larger than in the second pass. Only allow split.
        av1_set_square_split_only(part_state);
        return;
      } else if (block_size_wide[bsize] >= minSize &&
                 block_size_wide[bsize] <= maxSize) {
        // Partition is within a range where it is very likely to find a good
        // choice, so do not prune anything.
        return;
      }
    }
  }
#endif  // CONFIG_THREE_PASS

  // Prune rectangular partitions for larger blocks.
  if (bsize > cpi->sf.part_sf.rect_partition_eval_thresh) {
    part_state->do_rectangular_split = 0;
    part_state->partition_rect_allowed[HORZ] = 0;
    part_state->partition_rect_allowed[VERT] = 0;
  }

  // Prune rectangular, AB and 4-way partition based on q index and block size
  if (cpi->sf.part_sf.prune_rectangular_split_based_on_qidx == 1) {
    if (bsize == BLOCK_8X8 && x->qindex < 35)
      av1_disable_rect_partitions(part_state);

  } else if (cpi->sf.part_sf.prune_rectangular_split_based_on_qidx == 2) {
    // Enumeration difference between two square partitions
    const int sqr_bsize_step = BLOCK_32X32 - BLOCK_16X16;
    int max_bsize =
        BLOCK_32X32 - (x->qindex * 3 / QINDEX_RANGE) * sqr_bsize_step;
    max_bsize = AOMMAX(max_bsize, BLOCK_4X4);
    const BLOCK_SIZE max_prune_bsize =
        (BLOCK_SIZE)AOMMIN(max_bsize, BLOCK_32X32);

    // Prune partition
    // qidx 0 to 85: prune bsize below BLOCK_32X32
    // qidx 86 to 170: prune bsize below BLOCK_16X16
    // qidx 171 to 255: prune bsize below BLOCK_8X8
    if (bsize < max_prune_bsize) {
      av1_disable_rect_partitions(part_state);
    }
  }

  if (cpi->sf.part_sf.prune_sub_8x8_partition_level && (bsize == BLOCK_8X8)) {
    const MACROBLOCKD *const xd = &x->e_mbd;
    int prune_sub_8x8;
    if (cpi->sf.part_sf.prune_sub_8x8_partition_level == 2) {
      prune_sub_8x8 = 1;
    } else {
      assert(cpi->sf.part_sf.prune_sub_8x8_partition_level == 1);
      // Prune if both neighbors are available and either is > BLOCK_8X8
      prune_sub_8x8 = xd->left_available && xd->up_available &&
                      (xd->left_mbmi->bsize > BLOCK_8X8 ||
                       xd->above_mbmi->bsize > BLOCK_8X8);
    }
    if (prune_sub_8x8) {
      av1_disable_all_splits(part_state);
    }
  }

  // A CNN-based speed feature pruning out either split or all non-split
  // partition in INTRA frame coding.
  const int try_intra_cnn_based_part_prune =
      frame_is_intra_only(cm) &&
      cpi->sf.part_sf.intra_cnn_based_part_prune_level &&
      cm->seq_params->sb_size >= BLOCK_64X64 && bsize <= BLOCK_64X64 &&
      blk_params->bsize_at_least_8x8 &&
      av1_is_whole_blk_in_frame(blk_params, mi_params);

  if (try_intra_cnn_based_part_prune) {
    intra_mode_cnn_partition(&cpi->common, x, x->part_search_info.quad_tree_idx,
                             cpi->sf.part_sf.intra_cnn_based_part_prune_level,
                             part_state);
  }

  // Use simple motion search to prune out split or non-split partitions. This
  // must be done prior to PARTITION_SPLIT to propagate the initial mvs to a
  // smaller blocksize.
  const int try_split_only =
      cpi->sf.part_sf.simple_motion_search_split &&
      part_state->do_square_split && blk_params->bsize_at_least_8x8 &&
      av1_is_whole_blk_in_frame(blk_params, mi_params) &&
      !frame_is_intra_only(cm) && !av1_superres_scaled(cm);

  if (try_split_only) {
    simple_motion_search_based_split(cpi, x, sms_tree, part_state);
  }

  // Use simple motion search to prune out rectangular partition in some
  // direction. The results are stored in prune_horz and prune_vert in order to
  // bypass future related pruning checks if a pruning decision has been made.

  // We want to search at least one partition mode, so don't prune if NONE and
  // SPLIT are disabled.
  const int non_rect_part_allowed =
      part_state->do_square_split || part_state->partition_none_allowed;
  // Only run the model if the partitions are not already pruned.
  const int rect_part_allowed = part_state->do_rectangular_split &&
                                ((part_state->partition_rect_allowed[HORZ] &&
                                  !part_state->prune_rect_part[HORZ]) ||
                                 (part_state->partition_rect_allowed[VERT] &&
                                  !part_state->prune_rect_part[VERT]));

  const int try_prune_rect = cpi->sf.part_sf.simple_motion_search_prune_rect &&
                             !frame_is_intra_only(cm) &&
                             non_rect_part_allowed && rect_part_allowed &&
                             !av1_superres_scaled(cm);

  if (try_prune_rect) {
    simple_motion_search_prune_rect(cpi, x, sms_tree, part_state);
  }
}